

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::onEnterLiteralExpressionAstNode
          (SemanticAnalyzerRun *this,LiteralExpressionAstNode *node)

{
  TokenType TVar1;
  element_type *peVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 uVar5;
  shared_ptr<Token> *token;
  int iVar6;
  _Alloc_hider local_58;
  char *__endptr;
  undefined8 local_48;
  SemanticAnalyzerRun *local_38;
  
  peVar2 = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  token = &node->token;
  TVar1 = peVar2->tokenType;
  if (TVar1 != FloatLiteral) {
    if (TVar1 != IntegerLiteral) {
      return;
    }
    pcVar3 = (peVar2->value)._M_dataplus._M_p;
    local_38 = this;
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    *piVar4 = 0;
    strtoll(pcVar3,&stack0xffffffffffffffa8._M_p,10);
    if (local_58._M_p != pcVar3) {
      if (*piVar4 == 0) goto LAB_00110ce1;
      if (*piVar4 != 0x22) {
        return;
      }
      std::__throw_out_of_range("stoll");
    }
    uVar5 = std::__throw_invalid_argument("stoll");
    if (*piVar4 == 0) {
      *piVar4 = iVar6;
    }
    __cxa_begin_catch(uVar5);
    local_58._M_p = (pointer)&stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,"Invalid value for integer literal.","");
    reportError(local_38,token,(string *)&stack0xffffffffffffffa8);
    if (local_58._M_p != (pointer)&stack0xffffffffffffffb8) {
      operator_delete(local_58._M_p,local_48 + 1);
    }
    __cxa_end_catch();
    this = local_38;
  }
  pcVar3 = (((token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->value).
           _M_dataplus._M_p;
  local_38 = this;
  piVar4 = __errno_location();
  iVar6 = *piVar4;
  *piVar4 = 0;
  strtod(pcVar3,&stack0xffffffffffffffa8._M_p);
  if (local_58._M_p == pcVar3) {
    uVar5 = std::__throw_invalid_argument("stod");
    if (*piVar4 == 0) {
      *piVar4 = iVar6;
    }
    __cxa_begin_catch(uVar5);
    local_58._M_p = (pointer)&stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,"Invalid value for float literal.","");
    reportError(local_38,token,(string *)&stack0xffffffffffffffa8);
    if (local_58._M_p != (pointer)&stack0xffffffffffffffb8) {
      operator_delete(local_58._M_p,local_48 + 1);
    }
    __cxa_end_catch();
    return;
  }
  if (*piVar4 != 0) {
    if (*piVar4 != 0x22) {
      return;
    }
    std::__throw_out_of_range("stod");
  }
LAB_00110ce1:
  *piVar4 = iVar6;
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::IntegerLiteral: {
        try {
          std::stoll(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for integer literal.");
        }
      }
      case TokenType::FloatLiteral: {
        try {
          std::stod(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for float literal.");
        }
      }
      default:
        return;
    }
  }